

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.cpp
# Opt level: O0

void __thiscall JsonBoolean_False_Test::~JsonBoolean_False_Test(JsonBoolean_False_Test *this)

{
  JsonBoolean_False_Test *this_local;
  
  ~JsonBoolean_False_Test(this);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (JsonBoolean, False) {
    StrictMock<mock_json_callbacks> callbacks;
    callbacks_proxy<mock_json_callbacks> proxy (callbacks);
    EXPECT_CALL (callbacks, boolean_value (false)).Times (1);

    json::parser<decltype (proxy)> p = json::make_parser (proxy);
    p.input (" false "s);
    p.eof ();
    EXPECT_FALSE (p.has_error ());
}